

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger get_slice_params(HSQUIRRELVM v,SQInteger *sidx,SQInteger *eidx,SQObjectPtr *o)

{
  SQObjectType SVar1;
  SQInteger SVar2;
  SQObjectPtr *pSVar3;
  SQObjectValue SVar4;
  SQTable *pSVar5;
  
  SVar2 = sq_gettop(v);
  *sidx = 0;
  *eidx = 0;
  pSVar3 = stack_get(v,1);
  SQObjectPtr::operator=(o,pSVar3);
  if (1 < SVar2) {
    pSVar3 = stack_get(v,2);
    SVar1 = (pSVar3->super_SQObject)._type;
    if ((SVar1 >> 0x1a & 1) != 0) {
      if (SVar1 == OT_FLOAT) {
        SVar4.nInteger = (SQInteger)(pSVar3->super_SQObject)._unVal.fFloat;
      }
      else {
        SVar4 = (pSVar3->super_SQObject)._unVal;
      }
      *sidx = (SQInteger)SVar4;
    }
    if (SVar2 != 2) {
      pSVar3 = stack_get(v,3);
      SVar1 = (pSVar3->super_SQObject)._type;
      if ((SVar1 >> 0x1a & 1) == 0) {
        return (SQInteger)pSVar3;
      }
      if (SVar1 == OT_FLOAT) {
        pSVar5 = (SQTable *)(long)(pSVar3->super_SQObject)._unVal.fFloat;
      }
      else {
        pSVar5 = (pSVar3->super_SQObject)._unVal.pTable;
      }
      goto LAB_00122713;
    }
  }
  pSVar5 = (SQTable *)sq_getsize(v,1);
LAB_00122713:
  *eidx = (SQInteger)pSVar5;
  return (SQInteger)pSVar5;
}

Assistant:

static SQInteger get_slice_params(HSQUIRRELVM v,SQInteger &sidx,SQInteger &eidx,SQObjectPtr &o)
{
    SQInteger top = sq_gettop(v);
    sidx=0;
    eidx=0;
    o=stack_get(v,1);
    if(top>1){
        SQObjectPtr &start=stack_get(v,2);
        if(sq_type(start)!=OT_NULL && sq_isnumeric(start)){
            sidx=tointeger(start);
        }
    }
    if(top>2){
        SQObjectPtr &end=stack_get(v,3);
        if(sq_isnumeric(end)){
            eidx=tointeger(end);
        }
    }
    else {
        eidx = sq_getsize(v,1);
    }
    return 1;
}